

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
Service_AddNodes_existing
          (UA_Server *server,UA_Session *session,UA_Node *node,UA_NodeId *parentNodeId,
          UA_NodeId *referenceTypeId,UA_NodeId *typeDefinition,
          UA_InstantiationCallback *instantiationCallback,UA_NodeId *addedNodeId)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  UA_Logger p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  UA_NodeId UVar15;
  UA_NodeId UVar16;
  UA_Boolean UVar17;
  UA_StatusCode UVar18;
  char *pcVar19;
  uint local_238;
  uint local_230;
  uint local_22c;
  uint local_1f8;
  uint local_1f0;
  uint local_1ec;
  uint local_1d8;
  uint local_1d0;
  uint local_1cc;
  uint local_198;
  uint local_190;
  uint local_18c;
  uint local_158;
  uint local_150;
  uint local_14c;
  uint local_138;
  uint local_130;
  uint local_12c;
  undefined1 local_120 [8];
  UA_NodeId baseobjecttype;
  UA_NodeId basedatavariabletype;
  UA_AddReferencesItem item;
  UA_NodeId *pUStack_68;
  UA_StatusCode retval;
  UA_NodeId *typeDefinition_local;
  UA_NodeId *referenceTypeId_local;
  UA_NodeId *parentNodeId_local;
  UA_Node *node_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (server->namespacesSize <= (ulong)(node->nodeId).namespaceIndex) {
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_130 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_12c = 0;
      }
      else {
        local_12c = session->channel->connection->sockfd;
      }
      local_130 = local_12c;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_138 = 0;
    }
    else {
      local_138 = (session->channel->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Namespace invalid"
                ,(ulong)local_130,(ulong)local_138,(ulong)(session->sessionId).identifier.numeric,
                (uint)(session->sessionId).identifier.guid.data2,
                (uint)(session->sessionId).identifier.guid.data3,
                (uint)(session->sessionId).identifier.guid.data4[0],
                (uint)(session->sessionId).identifier.guid.data4[1],
                (uint)(session->sessionId).identifier.guid.data4[2],
                (uint)(session->sessionId).identifier.guid.data4[3],
                (uint)(session->sessionId).identifier.guid.data4[4],
                (uint)(session->sessionId).identifier.guid.data4[5],
                (uint)(session->sessionId).identifier.guid.data4[6],
                (uint)(session->sessionId).identifier.guid.data4[7]);
    UA_NodeStore_deleteNode(node);
    return 0x80330000;
  }
  UVar18 = checkParentReference(server,session,node->nodeClass,parentNodeId,referenceTypeId);
  if (UVar18 != 0) {
    p_Var12 = (server->config).logger;
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_150 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_14c = 0;
      }
      else {
        local_14c = session->channel->connection->sockfd;
      }
      local_150 = local_14c;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_158 = 0;
    }
    else {
      local_158 = (session->channel->securityToken).channelId;
    }
    uVar11 = (session->sessionId).identifier.numeric;
    uVar9 = (session->sessionId).identifier.guid.data2;
    uVar10 = (session->sessionId).identifier.guid.data3;
    bVar1 = (session->sessionId).identifier.guid.data4[0];
    bVar2 = (session->sessionId).identifier.guid.data4[1];
    bVar3 = (session->sessionId).identifier.guid.data4[2];
    bVar4 = (session->sessionId).identifier.guid.data4[3];
    bVar5 = (session->sessionId).identifier.guid.data4[4];
    bVar6 = (session->sessionId).identifier.guid.data4[5];
    bVar7 = (session->sessionId).identifier.guid.data4[6];
    bVar8 = (session->sessionId).identifier.guid.data4[7];
    pcVar19 = UA_StatusCode_name(UVar18);
    UA_LOG_INFO(p_Var12,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Checking the reference to the parent returned error code %s"
                ,(ulong)local_150,(ulong)local_158,(ulong)uVar11,(uint)uVar9,(uint)uVar10,
                (uint)bVar1,(uint)bVar2,(uint)bVar3,(uint)bVar4,(uint)bVar5,(uint)bVar6,(uint)bVar7,
                (uint)bVar8,pcVar19);
    UA_NodeStore_deleteNode(node);
    return UVar18;
  }
  UVar18 = UA_NodeStore_insert(server->nodestore,node);
  if (UVar18 != 0) {
    p_Var12 = (server->config).logger;
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_190 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_18c = 0;
      }
      else {
        local_18c = session->channel->connection->sockfd;
      }
      local_190 = local_18c;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_198 = 0;
    }
    else {
      local_198 = (session->channel->securityToken).channelId;
    }
    uVar11 = (session->sessionId).identifier.numeric;
    uVar9 = (session->sessionId).identifier.guid.data2;
    uVar10 = (session->sessionId).identifier.guid.data3;
    bVar1 = (session->sessionId).identifier.guid.data4[0];
    bVar2 = (session->sessionId).identifier.guid.data4[1];
    bVar3 = (session->sessionId).identifier.guid.data4[2];
    bVar4 = (session->sessionId).identifier.guid.data4[3];
    bVar5 = (session->sessionId).identifier.guid.data4[4];
    bVar6 = (session->sessionId).identifier.guid.data4[5];
    bVar7 = (session->sessionId).identifier.guid.data4[6];
    bVar8 = (session->sessionId).identifier.guid.data4[7];
    pcVar19 = UA_StatusCode_name(UVar18);
    UA_LOG_INFO(p_Var12,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Node could not be added to the nodestore with error code %s"
                ,(ulong)local_190,(ulong)local_198,(ulong)uVar11,(uint)uVar9,(uint)uVar10,
                (uint)bVar1,(uint)bVar2,(uint)bVar3,(uint)bVar4,(uint)bVar5,(uint)bVar6,(uint)bVar7,
                (uint)bVar8,pcVar19);
    return UVar18;
  }
  if ((addedNodeId == (UA_NodeId *)0x0) ||
     (item._124_4_ = UA_NodeId_copy(&node->nodeId,addedNodeId), item._124_4_ == 0)) {
    UVar17 = UA_NodeId_isNull(parentNodeId);
    if (!UVar17) {
      UA_AddReferencesItem_init
                ((UA_AddReferencesItem *)((long)&basedatavariabletype.identifier + 8));
      basedatavariabletype.identifier.string.data = (UA_Byte *)*(undefined8 *)&node->nodeId;
      item._124_4_ = addReference(server,session,
                                  (UA_AddReferencesItem *)
                                  ((long)&basedatavariabletype.identifier + 8));
      if (item._124_4_ != 0) {
        p_Var12 = (server->config).logger;
        if (session->channel == (UA_SecureChannel *)0x0) {
          local_1f0 = 0;
        }
        else {
          if (session->channel->connection == (UA_Connection *)0x0) {
            local_1ec = 0;
          }
          else {
            local_1ec = session->channel->connection->sockfd;
          }
          local_1f0 = local_1ec;
        }
        if (session->channel == (UA_SecureChannel *)0x0) {
          local_1f8 = 0;
        }
        else {
          local_1f8 = (session->channel->securityToken).channelId;
        }
        uVar11 = (session->sessionId).identifier.numeric;
        uVar9 = (session->sessionId).identifier.guid.data2;
        uVar10 = (session->sessionId).identifier.guid.data3;
        bVar1 = (session->sessionId).identifier.guid.data4[0];
        bVar2 = (session->sessionId).identifier.guid.data4[1];
        bVar3 = (session->sessionId).identifier.guid.data4[2];
        bVar4 = (session->sessionId).identifier.guid.data4[3];
        bVar5 = (session->sessionId).identifier.guid.data4[4];
        bVar6 = (session->sessionId).identifier.guid.data4[5];
        bVar7 = (session->sessionId).identifier.guid.data4[6];
        bVar8 = (session->sessionId).identifier.guid.data4[7];
        pcVar19 = UA_StatusCode_name(item._124_4_);
        UA_LOG_INFO(p_Var12,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not add the reference to the parentwith error code %s"
                    ,(ulong)local_1f0,(ulong)local_1f8,(ulong)uVar11,(uint)uVar9,(uint)uVar10,
                    (uint)bVar1,(uint)bVar2,(uint)bVar3,(uint)bVar4,(uint)bVar5,(uint)bVar6,
                    (uint)bVar7,(uint)bVar8,pcVar19);
        goto LAB_0012e67b;
      }
    }
    UA_NODEID_NUMERIC((UA_NodeId *)((long)&baseobjecttype.identifier + 8),0,0x3f);
    UA_NODEID_NUMERIC((UA_NodeId *)local_120,0,0x3a);
    pUStack_68 = typeDefinition;
    if ((node->nodeClass == UA_NODECLASS_VARIABLE) || (node->nodeClass == UA_NODECLASS_OBJECT)) {
      if ((typeDefinition == (UA_NodeId *)0x0) ||
         (UVar17 = UA_NodeId_isNull(typeDefinition), UVar17)) {
        if (node->nodeClass == UA_NODECLASS_VARIABLE) {
          pUStack_68 = (UA_NodeId *)((long)&baseobjecttype.identifier + 8);
        }
        else {
          pUStack_68 = (UA_NodeId *)local_120;
        }
      }
      item._124_4_ = instantiateNode(server,session,&node->nodeId,node->nodeClass,pUStack_68,
                                     instantiationCallback);
      if (item._124_4_ != 0) {
        p_Var12 = (server->config).logger;
        if (session->channel == (UA_SecureChannel *)0x0) {
          local_230 = 0;
        }
        else {
          if (session->channel->connection == (UA_Connection *)0x0) {
            local_22c = 0;
          }
          else {
            local_22c = session->channel->connection->sockfd;
          }
          local_230 = local_22c;
        }
        if (session->channel == (UA_SecureChannel *)0x0) {
          local_238 = 0;
        }
        else {
          local_238 = (session->channel->securityToken).channelId;
        }
        uVar11 = (session->sessionId).identifier.numeric;
        uVar9 = (session->sessionId).identifier.guid.data2;
        uVar10 = (session->sessionId).identifier.guid.data3;
        bVar1 = (session->sessionId).identifier.guid.data4[0];
        bVar2 = (session->sessionId).identifier.guid.data4[1];
        bVar3 = (session->sessionId).identifier.guid.data4[2];
        bVar4 = (session->sessionId).identifier.guid.data4[3];
        bVar5 = (session->sessionId).identifier.guid.data4[4];
        bVar6 = (session->sessionId).identifier.guid.data4[5];
        bVar7 = (session->sessionId).identifier.guid.data4[6];
        bVar8 = (session->sessionId).identifier.guid.data4[7];
        pcVar19 = UA_StatusCode_name(item._124_4_);
        UA_LOG_INFO(p_Var12,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not instantiate the node witherror code %s"
                    ,(ulong)local_230,(ulong)local_238,(ulong)uVar11,(uint)uVar9,(uint)uVar10,
                    (uint)bVar1,(uint)bVar2,(uint)bVar3,(uint)bVar4,(uint)bVar5,(uint)bVar6,
                    (uint)bVar7,(uint)bVar8,pcVar19);
        goto LAB_0012e67b;
      }
    }
    if (instantiationCallback != (UA_InstantiationCallback *)0x0) {
      uVar13 = *(undefined8 *)((long)&(node->nodeId).identifier + 8);
      uVar14 = *(undefined8 *)((long)&pUStack_68->identifier + 8);
      UVar15.identifier.string.length._4_4_ = (int)((node->nodeId).identifier.string.length >> 0x20)
      ;
      UVar15._0_12_ = *(undefined1 (*) [12])&node->nodeId;
      UVar15.identifier._8_4_ = (int)uVar13;
      UVar15.identifier._12_4_ = (int)((ulong)uVar13 >> 0x20);
      UVar16.identifier.string.length._4_4_ = (int)((pUStack_68->identifier).string.length >> 0x20);
      UVar16._0_12_ = *(undefined1 (*) [12])pUStack_68;
      UVar16.identifier._8_4_ = (int)uVar14;
      UVar16.identifier._12_4_ = (int)((ulong)uVar14 >> 0x20);
      (*instantiationCallback->method)(UVar15,UVar16,instantiationCallback->handle);
    }
    server_local._4_4_ = 0;
  }
  else {
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_1d0 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_1cc = 0;
      }
      else {
        local_1cc = session->channel->connection->sockfd;
      }
      local_1d0 = local_1cc;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_1d8 = 0;
    }
    else {
      local_1d8 = (session->channel->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not copy the nodeid"
                ,(ulong)local_1d0,(ulong)local_1d8,(ulong)(session->sessionId).identifier.numeric,
                (uint)(session->sessionId).identifier.guid.data2,
                (uint)(session->sessionId).identifier.guid.data3,
                (uint)(session->sessionId).identifier.guid.data4[0],
                (uint)(session->sessionId).identifier.guid.data4[1],
                (uint)(session->sessionId).identifier.guid.data4[2],
                (uint)(session->sessionId).identifier.guid.data4[3],
                (uint)(session->sessionId).identifier.guid.data4[4],
                (uint)(session->sessionId).identifier.guid.data4[5],
                (uint)(session->sessionId).identifier.guid.data4[6],
                (uint)(session->sessionId).identifier.guid.data4[7]);
LAB_0012e67b:
    deleteNode(server,&adminSession,&node->nodeId,true);
    server_local._4_4_ = item._124_4_;
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
Service_AddNodes_existing(UA_Server *server, UA_Session *session, UA_Node *node,
                          const UA_NodeId *parentNodeId, const UA_NodeId *referenceTypeId,
                          const UA_NodeId *typeDefinition,
                          UA_InstantiationCallback *instantiationCallback,
                          UA_NodeId *addedNodeId) {
    UA_ASSERT_RCU_LOCKED();

    /* Check the namespaceindex */
    if(node->nodeId.namespaceIndex >= server->namespacesSize) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "AddNodes: Namespace invalid");
        UA_NodeStore_deleteNode(node);
        return UA_STATUSCODE_BADNODEIDINVALID;
    }

    /* Check the reference to the parent */
    UA_StatusCode retval = checkParentReference(server, session, node->nodeClass,
                                                parentNodeId, referenceTypeId);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "AddNodes: Checking the reference to the parent returned "
                            "error code %s", UA_StatusCode_name(retval));
        UA_NodeStore_deleteNode(node);
        return retval;
    }

    /* Add the node to the nodestore */
    retval = UA_NodeStore_insert(server->nodestore, node);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "AddNodes: Node could not be added to the nodestore "
                            "with error code %s", UA_StatusCode_name(retval));
        return retval;
    }

    /* Copy the nodeid if needed */
    if(addedNodeId) {
        retval = UA_NodeId_copy(&node->nodeId, addedNodeId);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not copy the nodeid");
            goto remove_node;
        }
    }

    /* Hierarchical reference back to the parent */
    if(!UA_NodeId_isNull(parentNodeId)) {
        UA_AddReferencesItem item;
        UA_AddReferencesItem_init(&item);
        item.sourceNodeId = node->nodeId;
        item.referenceTypeId = *referenceTypeId;
        item.isForward = false;
        item.targetNodeId.nodeId = *parentNodeId;
        retval = addReference(server, session, &item);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not add the reference to the parent"
                                "with error code %s", UA_StatusCode_name(retval));
            goto remove_node;
        }
    }

    /* Fall back to a default typedefinition for variables and objects */
    const UA_NodeId basedatavariabletype = UA_NODEID_NUMERIC(0, UA_NS0ID_BASEDATAVARIABLETYPE);
    const UA_NodeId baseobjecttype = UA_NODEID_NUMERIC(0, UA_NS0ID_BASEOBJECTTYPE);
    if(node->nodeClass == UA_NODECLASS_VARIABLE ||
       node->nodeClass == UA_NODECLASS_OBJECT) {
        if(!typeDefinition || UA_NodeId_isNull(typeDefinition)) {
            if(node->nodeClass == UA_NODECLASS_VARIABLE)
                typeDefinition = &basedatavariabletype;
            else
                typeDefinition = &baseobjecttype;
        }

        /* Instantiate variables and objects */
        retval = instantiateNode(server, session, &node->nodeId, node->nodeClass,
                                 typeDefinition, instantiationCallback);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not instantiate the node with"
                                "error code %s", UA_StatusCode_name(retval));
            goto remove_node;
        }
    }

    /* Custom callback */
    if(instantiationCallback)
        instantiationCallback->method(node->nodeId, *typeDefinition,
                                      instantiationCallback->handle);
    return UA_STATUSCODE_GOOD;

 remove_node:
    deleteNode(server, &adminSession, &node->nodeId, true);
    return retval;
}